

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockContextQueueUndockWindow(ImGuiContext *ctx,ImGuiWindow *window)

{
  ImGuiDockRequest local_40;
  
  local_40.DockPayload = (ImGuiWindow *)0x0;
  local_40.DockTargetWindow = (ImGuiWindow *)0x0;
  local_40.DockTargetNode = (ImGuiDockNode *)0x0;
  local_40.UndockTargetNode = (ImGuiDockNode *)0x0;
  local_40.DockSplitDir = -1;
  local_40.DockSplitRatio = 0.5;
  local_40.DockSplitOuter = false;
  local_40.Type = ImGuiDockRequestType_Undock;
  local_40.UndockTargetWindow = window;
  ImVector<ImGuiDockRequest>::push_back(&(ctx->DockContext).Requests,&local_40);
  return;
}

Assistant:

void ImGui::DockContextQueueUndockWindow(ImGuiContext* ctx, ImGuiWindow* window)
{
    ImGuiDockRequest req;
    req.Type = ImGuiDockRequestType_Undock;
    req.UndockTargetWindow = window;
    ctx->DockContext.Requests.push_back(req);
}